

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

void __thiscall rapidxml::memory_pool<char>::clear(memory_pool<char> *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar1 = this->m_static_memory;
  pcVar3 = this->m_begin;
  while (pcVar3 != pcVar1) {
    pcVar2 = *(char **)(pcVar3 + (-(int)pcVar3 & 7));
    if (this->m_free_func == (free_func *)0x0) {
      operator_delete__(pcVar3);
    }
    else {
      (*this->m_free_func)(pcVar3);
    }
    this->m_begin = pcVar2;
    pcVar3 = pcVar2;
  }
  this->m_begin = pcVar1;
  this->m_ptr = pcVar1;
  this->m_end = (char *)&this->m_alloc_func;
  return;
}

Assistant:

void clear()
        {
            while (m_begin != m_static_memory)
            {
                char *previous_begin = reinterpret_cast<header *>(align(m_begin))->previous_begin;
                if (m_free_func)
                    m_free_func(m_begin);
                else
                    delete[] m_begin;
                m_begin = previous_begin;
            }
            init();
        }